

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall ON_SubDMeshFragment::SetColors(ON_SubDMeshFragment *this,ON_Color color)

{
  byte *pbVar1;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar2;
  size_t sVar3;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar8;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_1c;
  
  local_1c = color.field_0;
  uVar6 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
  uVar7 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_1c);
  aVar4 = local_1c;
  if (uVar6 == uVar7) {
    ClearColors(this);
    bVar5 = (bool)((*(byte *)((long)&this->m_vertex_capacity_etc + 1) & 0x20) >> 5);
  }
  else {
    this->m_ctrlnetC[0].field_0 = local_1c;
    this->m_ctrlnetC[1].field_0 = local_1c;
    this->m_ctrlnetC[2].field_0 = local_1c;
    this->m_ctrlnetC[3].field_0 = local_1c;
    uVar6 = ColorCapacity(this);
    if (uVar6 != 0) {
      paVar8 = &this->m_C->field_0;
      sVar3 = this->m_C_stride;
      paVar2 = paVar8 + uVar6 * sVar3;
      for (; paVar8 < paVar2; paVar8 = paVar8 + sVar3) {
        *paVar8 = aVar4;
      }
    }
    pbVar1 = (byte *)((long)&this->m_vertex_capacity_etc + 1);
    *pbVar1 = *pbVar1 | 0x20;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool ON_SubDMeshFragment::SetColors(ON_Color color) const
{
  if (ON_Color::UnsetColor == color)
  {
    ClearColors();
  }
  else
  {
    m_ctrlnetC[0] = color;
    m_ctrlnetC[1] = color;
    m_ctrlnetC[2] = color;
    m_ctrlnetC[3] = color;

    const size_t capacity = ColorCapacity();
    if (capacity > 0)
    {
      const size_t stride = m_C_stride;
      ON_Color* c = m_C;
      ON_Color* c1 = c + capacity * stride;
      while (c < c1)
      {
        *c = color;
        c += stride;
      }
    }
    this->SetColorsExistForExperts(true);
  }
  return ColorsExistForExperts();
}